

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_filter_rtp(Curl_easy *data,char *buf,size_t blen,size_t *pconsumed)

{
  connectdata *pcVar1;
  bool bVar2;
  int iVar3;
  CURLcode CVar4;
  anon_union_280_10_9f9d5394_for_proto *s;
  size_t sVar5;
  size_t *len;
  char *pcVar6;
  bool bVar7;
  size_t *local_a0;
  size_t needed;
  size_t rtp_len_1;
  char *rtp_buf;
  size_t rtp_len;
  int off;
  int idx;
  _Bool in_body;
  size_t skip_len;
  CURLcode result;
  rtsp_conn *rtspc;
  size_t *pconsumed_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  s = &pcVar1->proto;
  skip_len._4_4_ = CURLE_OK;
  _idx = 0;
  *pconsumed = 0;
  pconsumed_local = (size_t *)blen;
  blen_local = (size_t)buf;
  do {
    if (pconsumed_local == (size_t *)0x0) goto LAB_00178a45;
    bVar2 = false;
    if ((((data->req).headerline != 0) &&
        (bVar2 = false, (*(byte *)((long)&pcVar1->proto + 0x34) & 1) == 0)) &&
       (bVar2 = false, -1 < (data->req).size)) {
      bVar2 = (data->req).bytecount < (data->req).size;
    }
    switch((pcVar1->proto).rtspc.state) {
    case RTP_PARSE_SKIP:
      while( true ) {
        bVar7 = false;
        if (pconsumed_local != (size_t *)0x0) {
          bVar7 = *(char *)blen_local != '$';
        }
        if (!bVar7) break;
        if (((!bVar2) && (*(char *)blen_local == 'R')) && ((data->set).rtspreq != RTSPREQ_RECEIVE))
        {
          if (pconsumed_local < (size_t *)0x5) {
            local_a0 = pconsumed_local;
          }
          else {
            local_a0 = (size_t *)0x5;
          }
          iVar3 = strncmp((char *)blen_local,"RTSP/",(size_t)local_a0);
          if (iVar3 == 0) {
            (pcVar1->proto).rtspc.state = RTP_PARSE_SKIP;
            *(byte *)((long)&pcVar1->proto + 0x34) =
                 *(byte *)((long)&pcVar1->proto + 0x34) & 0xfe | 1;
            goto LAB_00178a45;
          }
        }
        *pconsumed = *pconsumed + 1;
        blen_local = blen_local + 1;
        pconsumed_local = (size_t *)((long)pconsumed_local + -1);
        _idx = _idx + 1;
      }
      if ((pconsumed_local != (size_t *)0x0) && (*(char *)blen_local == '$')) {
        if (_idx != 0) {
          skip_len._4_4_ = rtp_write_body_junk(data,(char *)(blen_local - _idx),_idx);
          _idx = 0;
          if (skip_len._4_4_ != CURLE_OK) goto LAB_00178a45;
        }
        CVar4 = Curl_dyn_addn((dynbuf *)&s->ftpc,(void *)blen_local,1);
        if (CVar4 != CURLE_OK) {
          skip_len._4_4_ = CURLE_OUT_OF_MEMORY;
          goto LAB_00178a45;
        }
        *pconsumed = *pconsumed + 1;
        blen_local = blen_local + 1;
        pconsumed_local = (size_t *)((long)pconsumed_local + -1);
        (pcVar1->proto).rtspc.state = RTP_PARSE_CHANNEL;
      }
      break;
    case RTP_PARSE_CHANNEL:
      if (((uint)(data->state).rtp_channel_mask[(int)(*(byte *)blen_local / 8)] &
          1 << *(byte *)blen_local % 8) == 0) {
        (pcVar1->proto).rtspc.state = RTP_PARSE_SKIP;
        if (*pconsumed == 0) {
          pcVar6 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
          skip_len._4_4_ = rtp_write_body_junk(data,pcVar6,1);
          if (skip_len._4_4_ != CURLE_OK) goto LAB_00178a45;
        }
        else {
          _idx = 1;
        }
        Curl_dyn_free((dynbuf *)&s->ftpc);
      }
      else {
        *(uint *)((long)&pcVar1->proto + 0x20) = (uint)*(byte *)blen_local;
        CVar4 = Curl_dyn_addn((dynbuf *)&s->ftpc,(void *)blen_local,1);
        if (CVar4 != CURLE_OK) {
          skip_len._4_4_ = CURLE_OUT_OF_MEMORY;
          goto LAB_00178a45;
        }
        *pconsumed = *pconsumed + 1;
        blen_local = blen_local + 1;
        pconsumed_local = (size_t *)((long)pconsumed_local + -1);
        (pcVar1->proto).rtspc.state = RTP_PARSE_LEN;
      }
      break;
    case RTP_PARSE_LEN:
      sVar5 = Curl_dyn_len((dynbuf *)&s->ftpc);
      CVar4 = Curl_dyn_addn((dynbuf *)&s->ftpc,(void *)blen_local,1);
      if (CVar4 != CURLE_OK) {
        skip_len._4_4_ = CURLE_OUT_OF_MEMORY;
        goto LAB_00178a45;
      }
      *pconsumed = *pconsumed + 1;
      blen_local = blen_local + 1;
      pconsumed_local = (size_t *)((long)pconsumed_local + -1);
      if (sVar5 != 2) {
        pcVar6 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
        *(ulong *)((long)&pcVar1->proto + 0x28) = (ulong)(CONCAT11(pcVar6[2],pcVar6[3]) + 4);
        (pcVar1->proto).rtspc.state = RTP_PARSE_DATA;
      }
      break;
    case RTP_PARSE_DATA:
      sVar5 = Curl_dyn_len((dynbuf *)&s->ftpc);
      len = (size_t *)((pcVar1->proto).ftpc.pp.response.tv_sec - sVar5);
      if (pconsumed_local < len) {
        CVar4 = Curl_dyn_addn((dynbuf *)&s->ftpc,(void *)blen_local,(size_t)pconsumed_local);
        if (CVar4 != CURLE_OK) {
          skip_len._4_4_ = CURLE_OUT_OF_MEMORY;
          goto LAB_00178a45;
        }
        *pconsumed = (long)pconsumed_local + *pconsumed;
        blen_local = (long)pconsumed_local + blen_local;
        pconsumed_local = (size_t *)0x0;
      }
      else {
        CVar4 = Curl_dyn_addn((dynbuf *)&s->ftpc,(void *)blen_local,(size_t)len);
        if (CVar4 != CURLE_OK) {
          skip_len._4_4_ = CURLE_OUT_OF_MEMORY;
          goto LAB_00178a45;
        }
        *pconsumed = (long)len + *pconsumed;
        blen_local = (long)len + blen_local;
        pconsumed_local = (size_t *)((long)pconsumed_local - (long)len);
        pcVar6 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
        skip_len._4_4_ = rtp_client_write(data,pcVar6,(pcVar1->proto).ftpc.pp.response.tv_sec);
        Curl_dyn_free((dynbuf *)&s->ftpc);
        (pcVar1->proto).rtspc.state = RTP_PARSE_SKIP;
        if (skip_len._4_4_ != CURLE_OK) {
LAB_00178a45:
          if ((skip_len._4_4_ == CURLE_OK) && (_idx != 0)) {
            skip_len._4_4_ = rtp_write_body_junk(data,(char *)(blen_local - _idx),_idx);
          }
          return skip_len._4_4_;
        }
      }
      break;
    default:
      return CURLE_RECV_ERROR;
    }
  } while( true );
}

Assistant:

static CURLcode rtsp_filter_rtp(struct Curl_easy *data,
                                     const char *buf,
                                     size_t blen,
                                     size_t *pconsumed)
{
  struct rtsp_conn *rtspc = &(data->conn->proto.rtspc);
  CURLcode result = CURLE_OK;
  size_t skip_len = 0;

  *pconsumed = 0;
  while(blen) {
    bool in_body = (data->req.headerline && !rtspc->in_header) &&
                   (data->req.size >= 0) &&
                   (data->req.bytecount < data->req.size);
    switch(rtspc->state) {

    case RTP_PARSE_SKIP: {
      DEBUGASSERT(Curl_dyn_len(&rtspc->buf) == 0);
      while(blen && buf[0] != '$') {
        if(!in_body && buf[0] == 'R' &&
           data->set.rtspreq != RTSPREQ_RECEIVE) {
          if(strncmp(buf, "RTSP/", (blen < 5) ? blen : 5) == 0) {
            /* This could be the next response, no consume and return */
            if(*pconsumed) {
              DEBUGF(infof(data, "RTP rtsp_filter_rtp[SKIP] RTSP/ prefix, "
                           "skipping %zd bytes of junk", *pconsumed));
            }
            rtspc->state = RTP_PARSE_SKIP;
            rtspc->in_header = TRUE;
            goto out;
          }
        }
        /* junk/BODY, consume without buffering */
        *pconsumed += 1;
        ++buf;
        --blen;
        ++skip_len;
      }
      if(blen && buf[0] == '$') {
        /* possible start of an RTP message, buffer */
        if(skip_len) {
          /* end of junk/BODY bytes, flush */
          result = rtp_write_body_junk(data,
                                       (char *)(buf - skip_len), skip_len);
          skip_len = 0;
          if(result)
            goto out;
        }
        if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += 1;
        ++buf;
        --blen;
        rtspc->state = RTP_PARSE_CHANNEL;
      }
      break;
    }

    case RTP_PARSE_CHANNEL: {
      int idx = ((unsigned char)buf[0]) / 8;
      int off = ((unsigned char)buf[0]) % 8;
      DEBUGASSERT(Curl_dyn_len(&rtspc->buf) == 1);
      if(!(data->state.rtp_channel_mask[idx] & (1 << off))) {
        /* invalid channel number, junk or BODY data */
        rtspc->state = RTP_PARSE_SKIP;
        DEBUGASSERT(skip_len == 0);
        /* we do not consume this byte, it is BODY data */
        DEBUGF(infof(data, "RTSP: invalid RTP channel %d, skipping", idx));
        if(*pconsumed == 0) {
          /* We did not consume the initial '$' in our buffer, but had
           * it from an earlier call. We cannot un-consume it and have
           * to write it directly as BODY data */
          result = rtp_write_body_junk(data, Curl_dyn_ptr(&rtspc->buf), 1);
          if(result)
            goto out;
        }
        else {
          /* count the '$' as skip and continue */
          skip_len = 1;
        }
        Curl_dyn_free(&rtspc->buf);
        break;
      }
      /* a valid channel, so we expect this to be a real RTP message */
      rtspc->rtp_channel = (unsigned char)buf[0];
      if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
      *pconsumed += 1;
      ++buf;
      --blen;
      rtspc->state = RTP_PARSE_LEN;
      break;
    }

    case RTP_PARSE_LEN: {
      size_t rtp_len = Curl_dyn_len(&rtspc->buf);
      const char *rtp_buf;
      DEBUGASSERT(rtp_len >= 2 && rtp_len < 4);
      if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
      *pconsumed += 1;
      ++buf;
      --blen;
      if(rtp_len == 2)
        break;
      rtp_buf = Curl_dyn_ptr(&rtspc->buf);
      rtspc->rtp_len = RTP_PKT_LENGTH(rtp_buf) + 4;
      rtspc->state = RTP_PARSE_DATA;
      break;
    }

    case RTP_PARSE_DATA: {
      size_t rtp_len = Curl_dyn_len(&rtspc->buf);
      size_t needed;
      DEBUGASSERT(rtp_len < rtspc->rtp_len);
      needed = rtspc->rtp_len - rtp_len;
      if(needed <= blen) {
        if(Curl_dyn_addn(&rtspc->buf, buf, needed)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += needed;
        buf += needed;
        blen -= needed;
        /* complete RTP message in buffer */
        DEBUGF(infof(data, "RTP write channel %d rtp_len %zu",
                     rtspc->rtp_channel, rtspc->rtp_len));
        result = rtp_client_write(data, Curl_dyn_ptr(&rtspc->buf),
                                  rtspc->rtp_len);
        Curl_dyn_free(&rtspc->buf);
        rtspc->state = RTP_PARSE_SKIP;
        if(result)
          goto out;
      }
      else {
        if(Curl_dyn_addn(&rtspc->buf, buf, blen)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += blen;
        buf += blen;
        blen = 0;
      }
      break;
    }

    default:
      DEBUGASSERT(0);
      return CURLE_RECV_ERROR;
    }
  }
out:
  if(!result && skip_len)
    result = rtp_write_body_junk(data, (char *)(buf - skip_len), skip_len);
  return result;
}